

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::InternalSwap
          (ConvolutionLayerParams *this,ConvolutionLayerParams *other)

{
  ConvolutionLayerParams *other_local;
  ConvolutionLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->kernelsize_,&other->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->stride_,&other->stride_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->dilationfactor_,&other->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  std::swap<CoreML::Specification::WeightParams*>(&this->weights_,&other->weights_);
  std::swap<CoreML::Specification::WeightParams*>(&this->bias_,&other->bias_);
  std::swap<unsigned_long>(&this->outputchannels_,&other->outputchannels_);
  std::swap<unsigned_long>(&this->kernelchannels_,&other->kernelchannels_);
  std::swap<unsigned_long>(&this->ngroups_,&other->ngroups_);
  std::swap<bool>(&this->isdeconvolution_,&other->isdeconvolution_);
  std::swap<bool>(&this->hasbias_,&other->hasbias_);
  std::swap<CoreML::Specification::ConvolutionLayerParams::ConvolutionPaddingTypeUnion>
            (&this->ConvolutionPaddingType_,&other->ConvolutionPaddingType_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ConvolutionLayerParams::InternalSwap(ConvolutionLayerParams* other) {
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  dilationfactor_.InternalSwap(&other->dilationfactor_);
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(weights_, other->weights_);
  std::swap(bias_, other->bias_);
  std::swap(outputchannels_, other->outputchannels_);
  std::swap(kernelchannels_, other->kernelchannels_);
  std::swap(ngroups_, other->ngroups_);
  std::swap(isdeconvolution_, other->isdeconvolution_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(ConvolutionPaddingType_, other->ConvolutionPaddingType_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}